

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

bool anon_unknown.dwarf_99e164::isDirentryToIgnore(char *fname)

{
  if (fname == (char *)0x0) {
    __assert_fail("fname != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmFindPackageCommand.cxx"
                  ,0x6d,"bool (anonymous namespace)::isDirentryToIgnore(const char *const)");
  }
  if (*fname == '.') {
    if (fname[1] == '\0') {
      return true;
    }
    if (fname[1] == '.') {
      return fname[2] == '\0';
    }
  }
  else if (*fname == '\0') {
    __assert_fail("fname[0] != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmFindPackageCommand.cxx"
                  ,0x6e,"bool (anonymous namespace)::isDirentryToIgnore(const char *const)");
  }
  return false;
}

Assistant:

bool isDirentryToIgnore(const char* const fname)
{
  assert(fname != nullptr);
  assert(fname[0] != 0);
  return fname[0] == '.' &&
    (fname[1] == 0 || (fname[1] == '.' && fname[2] == 0));
}